

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::updateButtonLayout(QWizardPrivate *this)

{
  const_iterator first;
  bool bVar1;
  QFlagsStorage<QWizard::WizardOption> QVar2;
  Int IVar3;
  int iVar4;
  QFlagsStorage<QWizard::WizardOption> QVar5;
  QFlagsStorage<QWizard::WizardOption> QVar6;
  QFlagsStorage<QWizard::WizardOption> size;
  QVarLengthArray<QWizard::WizardButton,_9LL> *this_00;
  QVarLengthArray<QWizard::WizardButton,_9LL> *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  int ArraySize;
  WizardButton array_1 [12];
  QVarLengthArray<QWizard::WizardButton,_9LL> array;
  WizardOption in_stack_ffffffffffffff2c;
  QList<QWizard::WizardButton> *in_stack_ffffffffffffff30;
  const_iterator last;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QFlagsStorageHelper<QWizard::WizardOption,_4> local_90;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QFlagsStorage<QWizard::WizardOption> in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 local_78 [12];
  QVLABaseBase local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[0xe].super_QVLAStorage<4UL,_4UL,_9LL>.array[0] & 1U) == 0) {
    memset(local_78,0xaa,0x30);
    memset(local_78,0xff,0x30);
    QVar2.i = (Int)QFlags<QWizard::WizardOption>::operator&
                             ((QFlags<QWizard::WizardOption> *)in_stack_ffffffffffffff30,
                              in_stack_ffffffffffffff2c);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff84);
    if (IVar3 != 0) {
      in_stack_ffffffffffffff80.i =
           (Int)QFlags<QWizard::WizardOption>::operator&
                          ((QFlags<QWizard::WizardOption> *)in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff2c);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff80);
      iVar4 = 0;
      if (IVar3 != 0) {
        iVar4 = 0xb;
      }
      local_78[iVar4] = 5;
    }
    local_78[1] = 9;
    QVar5.i = (Int)QFlags<QWizard::WizardOption>::operator&
                             ((QFlags<QWizard::WizardOption> *)in_stack_ffffffffffffff30,
                              in_stack_ffffffffffffff2c);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff7c);
    if (IVar3 != 0) {
      local_78[2] = 6;
    }
    QVar6.i = (Int)QFlags<QWizard::WizardOption>::operator&
                             ((QFlags<QWizard::WizardOption> *)in_stack_ffffffffffffff30,
                              in_stack_ffffffffffffff2c);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff78);
    if (IVar3 != 0) {
      local_78[3] = 7;
    }
    size.i = (Int)QFlags<QWizard::WizardOption>::operator&
                            ((QFlags<QWizard::WizardOption> *)in_stack_ffffffffffffff30,
                             in_stack_ffffffffffffff2c);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff74);
    if (IVar3 != 0) {
      local_78[4] = 8;
    }
    local_90.super_QFlagsStorage<QWizard::WizardOption>.i =
         (QFlagsStorage<QWizard::WizardOption>)
         QFlags<QWizard::WizardOption>::operator&
                   ((QFlags<QWizard::WizardOption> *)in_stack_ffffffffffffff30,
                    in_stack_ffffffffffffff2c);
    bVar1 = QFlags<QWizard::WizardOption>::operator!((QFlags<QWizard::WizardOption> *)&local_90);
    if (bVar1) {
      QFlags<QWizard::WizardOption>::operator&
                ((QFlags<QWizard::WizardOption> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff2c);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff6c);
      iVar4 = 10;
      if (IVar3 != 0) {
        iVar4 = 5;
      }
      local_78[iVar4] = 4;
    }
    local_78[6] = 0;
    local_78[7] = 1;
    local_78[8] = 2;
    local_78[9] = 3;
    setButtonLayout((QWizardPrivate *)CONCAT44(QVar2.i,in_stack_ffffffffffffff80.i),
                    (WizardButton *)CONCAT44(QVar5.i,QVar6.i),size.i);
  }
  else {
    last.i = (WizardButton *)in_RDI;
    memset(local_48,0xaa,0x40);
    QList<QWizard::WizardButton>::cbegin(in_stack_ffffffffffffff30);
    QList<QWizard::WizardButton>::cend(in_stack_ffffffffffffff30);
    first.i._4_4_ = in_stack_ffffffffffffff6c;
    first.i._0_4_ = in_stack_ffffffffffffff68;
    QVarLengthArray<QWizard::WizardButton,_9LL>::
    QVarLengthArray<QList<QWizard::WizardButton>::const_iterator,_true>(in_RDI,first,last);
    this_00 = (QVarLengthArray<QWizard::WizardButton,_9LL> *)
              QVarLengthArray<QWizard::WizardButton,_9LL>::constData
                        ((QVarLengthArray<QWizard::WizardButton,_9LL> *)0x7b4bbf);
    QVLABaseBase::size(local_48);
    setButtonLayout((QWizardPrivate *)
                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80.i),
                    (WizardButton *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    in_stack_ffffffffffffff74);
    QVarLengthArray<QWizard::WizardButton,_9LL>::~QVarLengthArray(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::updateButtonLayout()
{
    if (buttonsHaveCustomLayout) {
        QVarLengthArray<QWizard::WizardButton, QWizard::NButtons> array{
                buttonsCustomLayout.cbegin(), buttonsCustomLayout.cend()};
        setButtonLayout(array.constData(), int(array.size()));
    } else {
        // Positions:
        //     Help Stretch Custom1 Custom2 Custom3 Cancel Back Next Commit Finish Cancel Help

        const int ArraySize = 12;
        QWizard::WizardButton array[ArraySize];
        memset(array, -1, sizeof(array));
        Q_ASSERT(array[0] == QWizard::NoButton);

        if (opts & QWizard::HaveHelpButton) {
            int i = (opts & QWizard::HelpButtonOnRight) ? 11 : 0;
            array[i] = QWizard::HelpButton;
        }
        array[1] = QWizard::Stretch;
        if (opts & QWizard::HaveCustomButton1)
            array[2] = QWizard::CustomButton1;
        if (opts & QWizard::HaveCustomButton2)
            array[3] = QWizard::CustomButton2;
        if (opts & QWizard::HaveCustomButton3)
            array[4] = QWizard::CustomButton3;

        if (!(opts & QWizard::NoCancelButton)) {
            int i = (opts & QWizard::CancelButtonOnLeft) ? 5 : 10;
            array[i] = QWizard::CancelButton;
        }
        array[6] = QWizard::BackButton;
        array[7] = QWizard::NextButton;
        array[8] = QWizard::CommitButton;
        array[9] = QWizard::FinishButton;

        setButtonLayout(array, ArraySize);
    }
}